

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::listTags(Config *config)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TestSpec *this;
  ostream *poVar3;
  ITagAliasRegistry *tagAliases;
  TestSpecParser *this_00;
  IRegistryHub *pIVar4;
  undefined4 extraout_var_00;
  pointer pTVar5;
  TestCaseInfo *pTVar6;
  reference pbVar7;
  pointer ppVar8;
  pointer ppVar9;
  TextAttributes *pTVar10;
  size_t _value;
  size_type sVar11;
  ostream *poVar12;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_TagInfo>_>::value,_pair<iterator,_bool>_>
  _Var13;
  allocator local_521;
  string local_520 [32];
  pluralise local_500;
  string local_4d8 [32];
  string local_4b8 [32];
  TextAttributes local_498;
  undefined1 local_478 [40];
  Text wrapper;
  ostringstream local_3f8 [8];
  ostringstream oss;
  iterator local_280;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
  local_278;
  const_iterator countItEnd;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
  local_268;
  const_iterator countIt_1;
  TagInfo local_250;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
  local_218;
  _Base_ptr local_1c0;
  undefined1 local_1b8;
  _Self local_1b0;
  _Self local_1a8;
  iterator countIt;
  string lcaseTagName;
  string local_180 [8];
  string tagName;
  _Self local_160;
  const_iterator tagItEnd;
  const_iterator tagIt;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_148;
  const_iterator itEnd;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_138;
  const_iterator it;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  tagCounts;
  string local_e0 [32];
  TestSpecParser local_c0;
  TestSpec local_50;
  undefined1 local_28 [8];
  TestSpec testSpec;
  Config *config_local;
  
  testSpec.m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)config;
  iVar2 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  TestSpec::TestSpec((TestSpec *)local_28,(TestSpec *)CONCAT44(extraout_var,iVar2));
  this = (TestSpec *)
         (*(code *)((testSpec.m_filters.
                     super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_patterns).
                   super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[0xd].m_p)();
  bVar1 = TestSpec::hasFilters(this);
  if (bVar1) {
    poVar3 = cout();
    std::operator<<((ostream *)poVar3,"Tags for matching test cases:\n");
  }
  else {
    poVar3 = cout();
    std::operator<<((ostream *)poVar3,"All available tags:\n");
    tagAliases = ITagAliasRegistry::get();
    TestSpecParser::TestSpecParser(&local_c0,tagAliases);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_e0,"*",
               (allocator *)((long)&tagCounts._M_t._M_impl.super__Rb_tree_header._M_node_count + 7))
    ;
    this_00 = TestSpecParser::parse(&local_c0,(string *)local_e0);
    TestSpecParser::testSpec(&local_50,this_00);
    TestSpec::operator=((TestSpec *)local_28,&local_50);
    TestSpec::~TestSpec(&local_50);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&tagCounts._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    TestSpecParser::~TestSpecParser(&local_c0);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
         *)&matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&it);
  pIVar4 = getRegistryHub();
  iVar2 = (*pIVar4->_vptr_IRegistryHub[3])();
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x18))
            ((long *)CONCAT44(extraout_var_00,iVar2),local_28,
             testSpec.m_filters.
             super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage,&it,0);
  itEnd._M_current =
       (TestCase *)
       std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                 ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&it);
  __gnu_cxx::
  __normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
  ::__normal_iterator<Catch::TestCase*>
            ((__normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
              *)&local_138,
             (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)&itEnd);
  tagIt._M_node =
       (_Base_ptr)
       std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                 ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&it);
  __gnu_cxx::
  __normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
  ::__normal_iterator<Catch::TestCase*>
            ((__normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
              *)&local_148,
             (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)&tagIt);
  while (bVar1 = __gnu_cxx::operator!=(&local_138,&local_148), bVar1) {
    pTVar5 = __gnu_cxx::
             __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
             ::operator->(&local_138);
    pTVar6 = TestCase::getTestCaseInfo(pTVar5);
    tagItEnd._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&pTVar6->tags);
    pTVar5 = __gnu_cxx::
             __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
             ::operator->(&local_138);
    pTVar6 = TestCase::getTestCaseInfo(pTVar5);
    local_160._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&pTVar6->tags);
    while (bVar1 = std::operator!=(&tagItEnd,&local_160), bVar1) {
      pbVar7 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&tagItEnd);
      std::__cxx11::string::string(local_180,(string *)pbVar7);
      toLower((Catch *)&countIt,(string *)local_180);
      local_1a8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                   *)&matchedTestCases.
                      super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(key_type *)&countIt);
      local_1b0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                  *)&matchedTestCases.
                     super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
      bVar1 = std::operator==(&local_1a8,&local_1b0);
      if (bVar1) {
        TagInfo::TagInfo(&local_250);
        std::make_pair<std::__cxx11::string&,Catch::TagInfo>
                  (&local_218,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&countIt,
                   &local_250);
        _Var13 = std::
                 map<std::__cxx11::string,Catch::TagInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagInfo>>>
                 ::insert<std::pair<std::__cxx11::string,Catch::TagInfo>>
                           ((map<std::__cxx11::string,Catch::TagInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagInfo>>>
                             *)&matchedTestCases.
                                super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_218);
        countIt_1._M_node = (_Base_ptr)_Var13.first._M_node;
        local_1b8 = _Var13.second;
        local_1c0 = countIt_1._M_node;
        local_1a8._M_node = countIt_1._M_node;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
        ::~pair(&local_218);
        TagInfo::~TagInfo(&local_250);
      }
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
               ::operator->(&local_1a8);
      TagInfo::add(&ppVar8->second,(string *)local_180);
      std::__cxx11::string::~string((string *)&countIt);
      std::__cxx11::string::~string(local_180);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&tagItEnd);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&local_138);
  }
  countItEnd._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                *)&matchedTestCases.
                   super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
  ::_Rb_tree_const_iterator(&local_268,(iterator *)&countItEnd);
  local_280._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
              *)&matchedTestCases.
                 super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
  ::_Rb_tree_const_iterator(&local_278,&local_280);
  while (bVar1 = std::operator!=(&local_268,&local_278), bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_3f8);
    poVar12 = std::operator<<((ostream *)local_3f8,"  ");
    wrapper.lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = std::setw(2);
    poVar12 = std::operator<<(poVar12,wrapper.lines.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    ppVar9 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
             ::operator->(&local_268);
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,(ppVar9->second).count);
    std::operator<<(poVar12,"  ");
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
    ::operator->(&local_268);
    TagInfo::all_abi_cxx11_((TagInfo *)local_478);
    Tbc::TextAttributes::TextAttributes(&local_498);
    pTVar10 = Tbc::TextAttributes::setInitialIndent(&local_498,0);
    std::__cxx11::ostringstream::str();
    _value = std::__cxx11::string::size();
    pTVar10 = Tbc::TextAttributes::setIndent(pTVar10,_value);
    pTVar10 = Tbc::TextAttributes::setWidth(pTVar10,0x46);
    Tbc::Text::Text((Text *)(local_478 + 0x20),(string *)local_478,pTVar10);
    std::__cxx11::string::~string(local_4b8);
    std::__cxx11::string::~string((string *)local_478);
    poVar3 = cout();
    std::__cxx11::ostringstream::str();
    poVar12 = std::operator<<((ostream *)poVar3,local_4d8);
    poVar3 = Tbc::operator<<((ostream *)poVar12,(Text *)(local_478 + 0x20));
    std::operator<<((ostream *)poVar3,"\n");
    std::__cxx11::string::~string(local_4d8);
    Tbc::Text::~Text((Text *)(local_478 + 0x20));
    std::__cxx11::ostringstream::~ostringstream(local_3f8);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
    ::operator++(&local_268);
  }
  poVar3 = cout();
  sVar11 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
           ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                   *)&matchedTestCases.
                      super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_520,"tag",&local_521);
  pluralise::pluralise(&local_500,sVar11,(string *)local_520);
  poVar3 = operator<<(poVar3,&local_500);
  poVar12 = std::operator<<((ostream *)poVar3,"\n");
  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  pluralise::~pluralise(&local_500);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  sVar11 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
           ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                   *)&matchedTestCases.
                      super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&it);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
          *)&matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  TestSpec::~TestSpec((TestSpec *)local_28);
  return sVar11;
}

Assistant:

inline std::size_t listTags( Config const& config ) {
        TestSpec testSpec = config.testSpec();
        if( config.testSpec().hasFilters() )
            Catch::cout() << "Tags for matching test cases:\n";
        else {
            Catch::cout() << "All available tags:\n";
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        }

        std::map<std::string, TagInfo> tagCounts;

        std::vector<TestCase> matchedTestCases;
        getRegistryHub().getTestCaseRegistry().getFilteredTests( testSpec, config, matchedTestCases );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            for( std::set<std::string>::const_iterator  tagIt = it->getTestCaseInfo().tags.begin(),
                                                        tagItEnd = it->getTestCaseInfo().tags.end();
                    tagIt != tagItEnd;
                    ++tagIt ) {
                std::string tagName = *tagIt;
                std::string lcaseTagName = toLower( tagName );
                std::map<std::string, TagInfo>::iterator countIt = tagCounts.find( lcaseTagName );
                if( countIt == tagCounts.end() )
                    countIt = tagCounts.insert( std::make_pair( lcaseTagName, TagInfo() ) ).first;
                countIt->second.add( tagName );
            }
        }

        for( std::map<std::string, TagInfo>::const_iterator countIt = tagCounts.begin(),
                                                            countItEnd = tagCounts.end();
                countIt != countItEnd;
                ++countIt ) {
            std::ostringstream oss;
            oss << "  " << std::setw(2) << countIt->second.count << "  ";
            Text wrapper( countIt->second.all(), TextAttributes()
                                                    .setInitialIndent( 0 )
                                                    .setIndent( oss.str().size() )
                                                    .setWidth( CATCH_CONFIG_CONSOLE_WIDTH-10 ) );
            Catch::cout() << oss.str() << wrapper << "\n";
        }
        Catch::cout() << pluralise( tagCounts.size(), "tag" ) << "\n" << std::endl;
        return tagCounts.size();
    }